

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubsumptionDemodulationHelper.hpp
# Opt level: O2

bool __thiscall
Inferences::OverlayBinder::tryGetBinding(OverlayBinder *this,Var var,TermList *result)

{
  _Node_iterator_base<std::pair<const_unsigned_int,_Kernel::TermList>,_false> _Var1;
  key_type local_14;
  
  _Var1._M_cur = (__node_type *)
                 std::
                 _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Kernel::TermList>,_std::allocator<std::pair<const_unsigned_int,_Kernel::TermList>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Kernel::TermList>,_std::allocator<std::pair<const_unsigned_int,_Kernel::TermList>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                         *)this,&local_14);
  if ((_Var1._M_cur == (__node_type *)0x0) &&
     (_Var1._M_cur = (__node_type *)
                     std::
                     _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Kernel::TermList>,_std::allocator<std::pair<const_unsigned_int,_Kernel::TermList>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     ::find(&(this->m_overlay)._M_h,&local_14), _Var1._M_cur == (__node_type *)0x0))
  {
    return false;
  }
  result->_content =
       *(uint64_t *)
        ((long)&((_Var1._M_cur)->
                super__Hash_node_value<std::pair<const_unsigned_int,_Kernel::TermList>,_false>).
                super__Hash_node_value_base<std::pair<const_unsigned_int,_Kernel::TermList>_>.
                _M_storage._M_storage + 8);
  return true;
}

Assistant:

bool tryGetBinding(Var var, TermList& result) const
    {
      auto b_it = m_base.find(var);
      if (b_it != m_base.end()) {
        // var has base binding
        result = b_it->second;
        return true;
      } else {
        auto o_it = m_overlay.find(var);
        if (o_it != m_overlay.end()) {
          // var has overlay binding
          result = o_it->second;
          return true;
        } else {
          // var is unbound
          return false;
        }
      }
    }